

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlconfig.c
# Opt level: O0

int configure_urlbase(IXML_Document *doc,sockaddr *serverAddr,char *alias,time_t last_modified,
                     char *docURL)

{
  char *alias_name;
  size_t alias_content_length;
  char local_108 [8];
  char ipaddr_port [180];
  int local_4c;
  char *pcStack_48;
  int err_code;
  char *xml_str;
  char *new_alias;
  char *root_path;
  char *docURL_local;
  time_t last_modified_local;
  char *alias_local;
  sockaddr *serverAddr_local;
  IXML_Document *doc_local;
  
  new_alias = (char *)0x0;
  xml_str = (char *)0x0;
  pcStack_48 = (char *)0x0;
  root_path = docURL;
  docURL_local = (char *)last_modified;
  last_modified_local = (time_t)alias;
  alias_local = (char *)serverAddr;
  serverAddr_local = (sockaddr *)doc;
  local_4c = addrToString(serverAddr,local_108,0xb4);
  if ((((local_4c == 0) &&
       (local_4c = config_description_doc((IXML_Document *)serverAddr_local,local_108,&new_alias),
       local_4c == 0)) &&
      (local_4c = calc_alias((char *)last_modified_local,new_alias,&xml_str), local_4c == 0)) &&
     ((local_4c = calc_descURL(local_108,xml_str,root_path), local_4c == 0 &&
      (pcStack_48 = ixmlPrintDocument((IXML_Document *)serverAddr_local), pcStack_48 != (char *)0x0)
      ))) {
    UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a0,"desc url: %s\n",root_path);
    UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a1,"doc = %s\n",pcStack_48);
    alias_name = xml_str;
    alias_content_length = strlen(pcStack_48);
    local_4c = web_server_set_alias(alias_name,pcStack_48,alias_content_length,(time_t)docURL_local)
    ;
  }
  free(new_alias);
  free(xml_str);
  if (local_4c != 0) {
    ixmlFreeDOMString(pcStack_48);
  }
  return local_4c;
}

Assistant:

int configure_urlbase(IXML_Document *doc,
	const struct sockaddr *serverAddr,
	const char *alias,
	time_t last_modified,
	char docURL[LINE_SIZE])
{
	char *root_path = NULL;
	char *new_alias = NULL;
	char *xml_str = NULL;
	int err_code;
	char ipaddr_port[LINE_SIZE];

	/* get IP address and port */
	err_code = addrToString(serverAddr, ipaddr_port, sizeof(ipaddr_port));
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}

	/* config url-base in 'doc' */
	err_code = config_description_doc(doc, ipaddr_port, &root_path);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc alias */
	err_code = calc_alias(alias, root_path, &new_alias);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc full url for desc doc */
	err_code = calc_descURL(ipaddr_port, new_alias, docURL);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* xml doc to str */
	xml_str = ixmlPrintDocument(doc);
	if (xml_str == NULL) {
		goto error_handler;
	}

	UpnpPrintf(
		UPNP_INFO, API, __FILE__, __LINE__, "desc url: %s\n", docURL);
	UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__, "doc = %s\n", xml_str);
	/* store in web server */
	err_code = web_server_set_alias(
		new_alias, xml_str, strlen(xml_str), last_modified);

error_handler:
	free(root_path);
	free(new_alias);

	if (err_code != UPNP_E_SUCCESS) {
		ixmlFreeDOMString(xml_str);
	}
	return err_code;
}